

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hashing.h
# Opt level: O2

char * __thiscall
llvm::hashing::detail::hash_combine_recursive_helper::combine_data<unsigned_long>
          (hash_combine_recursive_helper *this,size_t *length,char *buffer_ptr,char *buffer_end,
          unsigned_long data)

{
  size_t sVar1;
  char *pcVar2;
  size_t __n;
  unsigned_long data_local;
  hash_state local_60;
  
  pcVar2 = buffer_ptr + 8;
  if (buffer_end < pcVar2) {
    __n = (long)buffer_end - (long)buffer_ptr;
    data_local = data;
    memcpy(buffer_ptr,&data_local,__n);
    if (*length == 0) {
      hash_state::create(&local_60,this->buffer,this->seed);
      (this->state).h6 = local_60.h6;
      (this->state).h4 = local_60.h4;
      (this->state).h5 = local_60.h5;
      (this->state).h2 = local_60.h2;
      (this->state).h3 = local_60.h3;
      (this->state).h0 = local_60.h0;
      (this->state).h1 = local_60.h1;
      sVar1 = 0x40;
    }
    else {
      hash_state::mix(&this->state,this->buffer);
      sVar1 = *length + 0x40;
    }
    *length = sVar1;
    pcVar2 = (char *)((long)this + (8 - __n));
    if (buffer_end < pcVar2) {
      abort();
    }
    memcpy(this,(void *)((long)&data_local + __n),8 - __n);
  }
  else {
    *(unsigned_long *)buffer_ptr = data;
  }
  return pcVar2;
}

Assistant:

char *combine_data(size_t &length, char *buffer_ptr, char *buffer_end, T data) {
    if (!store_and_advance(buffer_ptr, buffer_end, data)) {
      // Check for skew which prevents the buffer from being packed, and do
      // a partial store into the buffer to fill it. This is only a concern
      // with the variadic combine because that formation can have varying
      // argument types.
      size_t partial_store_size = buffer_end - buffer_ptr;
      memcpy(buffer_ptr, &data, partial_store_size);

      // If the store fails, our buffer is full and ready to hash. We have to
      // either initialize the hash state (on the first full buffer) or mix
      // this buffer into the existing hash state. Length tracks the *hashed*
      // length, not the buffered length.
      if (length == 0) {
        state = state.create(buffer, seed);
        length = 64;
      } else {
        // Mix this chunk into the current state and bump length up by 64.
        state.mix(buffer);
        length += 64;
      }
      // Reset the buffer_ptr to the head of the buffer for the next chunk of
      // data.
      buffer_ptr = buffer;

      // Try again to store into the buffer -- this cannot fail as we only
      // store types smaller than the buffer.
      if (!store_and_advance(buffer_ptr, buffer_end, data,
                             partial_store_size))
        abort();
    }
    return buffer_ptr;
  }